

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O0

void test_ADynArray_insertADynArray_success_middleIndex_fn(int _i)

{
  bool bVar1;
  undefined4 *puVar2;
  uintmax_t _ck_y_7;
  uintmax_t _ck_x_11;
  void *_ck_x_10;
  char *_ck_y_q_1;
  char *_ck_x_q_1;
  char *_ck_y_s_1;
  char *_ck_x_s_1;
  char *_ck_y_6;
  char *_ck_x_9;
  void *_ck_x_8;
  uintmax_t _ck_y_5;
  uintmax_t _ck_x_7;
  uintmax_t _ck_y_4;
  uintmax_t _ck_x_6;
  void *_ck_x_5;
  char *_ck_y_q;
  char *_ck_x_q;
  char *_ck_y_s;
  char *_ck_x_s;
  char *_ck_y_3;
  char *_ck_x_4;
  void *_ck_x_3;
  uintmax_t _ck_y_2;
  uintmax_t _ck_x_2;
  uintmax_t _ck_y_1;
  uintmax_t _ck_x_1;
  uintmax_t _ck_y;
  uintmax_t _ck_x;
  private_ACUtilsTest_ADynArray_CharArray srcArray;
  private_ACUtilsTest_ADynArray_CharArray destArray;
  int _i_local;
  
  memcpy(&srcArray.buffer,&PTR_private_ACUtilsTest_ADynArray_realloc_001a7610,0x30);
  memcpy(&_ck_x,&PTR_private_ACUtilsTest_ADynArray_realloc_001a7640,0x30);
  private_ACUtilsTest_ADynArray_reallocFail = false;
  puVar2 = (undefined4 *)(*(code *)srcArray.buffer)(0,8);
  *puVar2 = 0x36353130;
  *(undefined1 *)(puVar2 + 1) = 0;
  srcArray.growStrategy = (ACUtilsGrowStrategy)0x3;
  srcArray.deallocator = private_ACUtilsTest_ADynArray_growStrategy;
  srcArray.size = 8;
  srcArray.capacity = (*(code *)_ck_x)(0,8);
  *(undefined4 *)srcArray.capacity = 0x343332;
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  bVar1 = private_ACUtils_ADynArray_insertArray
                    (&srcArray.buffer,2,(void *)srcArray.capacity,(size_t)srcArray.growStrategy,1);
  if ((ulong)bVar1 == 1) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x3e1);
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x3e2,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju","destArray.size == 8",
                      "destArray.size",5,"8",8,0);
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x3e1,"Assertion \'_ck_x == _ck_y\' failed",
                    "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                    "(&srcArray == ((void*)0) ? &destArray != ((void*)0) : private_ACUtils_ADynArray_insertArray(&destArray, 2, (&srcArray)->buffer, (&srcArray)->size, sizeof(*(&destArray)->buffer))) == true"
                    ,
                    "(&srcArray == ((void*)0) ? &destArray != ((void*)0) : private_ACUtils_ADynArray_insertArray(&destArray, 2, (&srcArray)->buffer, (&srcArray)->size, sizeof(*(&destArray)->buffer)))"
                    ,(ulong)bVar1,"true",1,0);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_insertADynArray_success_middleIndex)
{
    struct private_ACUtilsTest_ADynArray_CharArray destArray = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    struct private_ACUtilsTest_ADynArray_CharArray srcArray = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    destArray.size = 5;
    destArray.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    destArray.capacity = 8;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    destArray.buffer = (char*) destArray.reallocator(nullptr, destArray.capacity);
    memcpy(destArray.buffer, "0156", 5);
    srcArray.size = 3;
    srcArray.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    srcArray.capacity = 8;
    srcArray.buffer = (char*) srcArray.reallocator(nullptr, srcArray.capacity);
    memcpy(srcArray.buffer, "234\0", 4);
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_insertADynArray(&destArray, 2, &srcArray), true);
    ACUTILSTEST_ASSERT_UINT_EQ(destArray.size, 8);
    ACUTILSTEST_ASSERT_UINT_EQ(destArray.capacity, 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(destArray.buffer);
    ACUTILSTEST_ASSERT_STR_EQ(destArray.buffer, "0123456");
    ACUTILSTEST_ASSERT_PTR_NONNULL(destArray.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(srcArray.size, 3);
    ACUTILSTEST_ASSERT_UINT_EQ(srcArray.capacity, 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(srcArray.buffer);
    ACUTILSTEST_ASSERT_STR_EQ(srcArray.buffer, "234");
    ACUTILSTEST_ASSERT_PTR_NONNULL(srcArray.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
    destArray.deallocator(destArray.buffer);
    srcArray.deallocator(srcArray.buffer);
}